

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManSetFlowRefs(Gia_Man_t *p,Vec_Int_t *vRefs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  long lVar6;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  
  Vec_IntFill(vRefs,p->nObjs,0);
  for (lVar6 = 0; lVar6 < p->nObjs; lVar6 = lVar6 + 1) {
    iVar2 = (int)lVar6;
    pGVar4 = Gia_ManObj(p,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar5 = *(ulong *)pGVar4;
    if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar5) {
      iVar3 = 1;
      if ((~*(uint *)(pGVar4 + -(uVar5 & 0x1fffffff)) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar4 + -(uVar5 & 0x1fffffff))) {
        Vec_IntAddToEntry(vRefs,iVar2 - ((uint)uVar5 & 0x1fffffff),1);
        uVar5 = *(ulong *)pGVar4;
      }
      uVar1 = (uint)(uVar5 >> 0x20);
      if ((~*(uint *)(pGVar4 + -(ulong)(uVar1 & 0x1fffffff)) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar4 + -(ulong)(uVar1 & 0x1fffffff))) {
        Vec_IntAddToEntry(vRefs,iVar2 - (uVar1 & 0x1fffffff),1);
      }
      if (p->pMuxes == (uint *)0x0) {
        iVar2 = Gia_ObjIsMuxType(pGVar4);
        if (iVar2 != 0) {
          pGVar4 = Gia_ObjRecognizeMux(pGVar4,&pData1,&pData0);
          pData0 = (Gia_Obj_t *)((ulong)pData0 & 0xfffffffffffffffe);
          pData1 = (Gia_Obj_t *)((ulong)pData1 & 0xfffffffffffffffe);
          uVar1 = *(uint *)((ulong)pGVar4 & 0xfffffffffffffffe);
          if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
            iVar2 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar4 & 0xfffffffffffffffe));
            Vec_IntAddToEntry(vRefs,iVar2,-1);
          }
          if ((pData0 == pData1) &&
             ((~*(uint *)pData0 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pData0)) {
            iVar2 = Gia_ObjId(p,pData0);
            iVar3 = -1;
            goto LAB_0059c1b8;
          }
        }
      }
      else if (p->pMuxes[lVar6] != 0) {
        pGVar4 = Gia_ObjFanin2(p,pGVar4);
        if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
          iVar2 = Gia_ObjFaninId2(p,iVar2);
LAB_0059c1b8:
          Vec_IntAddToEntry(vRefs,iVar2,iVar3);
        }
      }
    }
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar4 = Gia_ManCo(p,iVar2);
    iVar3 = Gia_ObjFaninId0p(p,pGVar4);
    pGVar4 = Gia_ManObj(p,iVar3);
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      Vec_IntAddToEntry(vRefs,iVar3,1);
    }
  }
  for (iVar2 = 0; iVar2 < vRefs->nSize; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(vRefs,iVar2);
    if (iVar3 < 1) {
      Vec_IntWriteEntry(vRefs,iVar2,1);
    }
  }
  return;
}

Assistant:

void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_IntFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAnd(Gia_ObjFanin2(p, pObj)) )
                Vec_IntAddToEntry( vRefs, Gia_ObjFaninId2(p, i), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAnd(pCtrl) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pCtrl), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAnd(pData0) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pData0), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Id)) )
            Vec_IntAddToEntry( vRefs, Id, 1 );
    for ( i = 0; i < Vec_IntSize(vRefs); i++ )
        Vec_IntUpdateEntry( vRefs, i, 1 );
}